

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void aom_hadamard_lp_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 auVar1 [32];
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  lVar3 = 0;
  do {
    aom_hadamard_lp_8x8_dual_avx2(src_diff,src_stride,(int16_t *)((long)coeff + lVar3));
    lVar3 = lVar3 + 0x100;
    src_diff = src_diff + src_stride * 8;
  } while (lVar3 == 0x100);
  uVar2 = 0xfffffff0;
  do {
    auVar1 = vpaddw_avx2(*(undefined1 (*) [32])((long)coeff + 0x80),*(undefined1 (*) [32])coeff);
    auVar4 = vpsubw_avx2(*(undefined1 (*) [32])coeff,*(undefined1 (*) [32])((long)coeff + 0x80));
    auVar5 = vpaddw_avx2(*(undefined1 (*) [32])((long)coeff + 0x180),
                         *(undefined1 (*) [32])((long)coeff + 0x100));
    auVar6 = vpsubw_avx2(*(undefined1 (*) [32])((long)coeff + 0x100),
                         *(undefined1 (*) [32])((long)coeff + 0x180));
    auVar7 = vpsraw_avx2(auVar1,1);
    auVar4 = vpsraw_avx2(auVar4,1);
    auVar5 = vpsraw_avx2(auVar5,1);
    auVar6 = vpsraw_avx2(auVar6,1);
    auVar1 = vpaddw_avx2(auVar5,auVar7);
    *(undefined1 (*) [32])coeff = auVar1;
    auVar1 = vpaddw_avx2(auVar6,auVar4);
    *(undefined1 (*) [32])((long)coeff + 0x80) = auVar1;
    auVar1 = vpsubw_avx2(auVar7,auVar5);
    *(undefined1 (*) [32])((long)coeff + 0x100) = auVar1;
    auVar1 = vpsubw_avx2(auVar4,auVar6);
    *(undefined1 (*) [32])((long)coeff + 0x180) = auVar1;
    coeff = (int16_t *)((long)coeff + 0x20);
    uVar2 = uVar2 + 0x10;
  } while (uVar2 < 0x30);
  return;
}

Assistant:

void aom_hadamard_lp_16x16_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 2; ++idx) {
    const int16_t *src_ptr = src_diff + idx * 8 * src_stride;
    aom_hadamard_lp_8x8_dual_avx2(src_ptr, src_stride,
                                  t_coeff + (idx * 64 * 2));
  }

  for (int idx = 0; idx < 64; idx += 16) {
    const __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    const __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 64));
    const __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 128));
    const __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 192));

    __m256i b0 = _mm256_add_epi16(coeff0, coeff1);
    __m256i b1 = _mm256_sub_epi16(coeff0, coeff1);
    __m256i b2 = _mm256_add_epi16(coeff2, coeff3);
    __m256i b3 = _mm256_sub_epi16(coeff2, coeff3);

    b0 = _mm256_srai_epi16(b0, 1);
    b1 = _mm256_srai_epi16(b1, 1);
    b2 = _mm256_srai_epi16(b2, 1);
    b3 = _mm256_srai_epi16(b3, 1);
    _mm256_storeu_si256((__m256i *)coeff, _mm256_add_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 64), _mm256_add_epi16(b1, b3));
    _mm256_storeu_si256((__m256i *)(coeff + 128), _mm256_sub_epi16(b0, b2));
    _mm256_storeu_si256((__m256i *)(coeff + 192), _mm256_sub_epi16(b1, b3));
    coeff += 16;
    t_coeff += 16;
  }
}